

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9VmOutputConsume(jx9_vm *pVm,SyString *pString)

{
  int local_24;
  sxi32 rc;
  jx9_output_consumer *pCons;
  SyString *pString_local;
  jx9_vm *pVm_local;
  
  local_24 = 0;
  if (pString->nByte != 0) {
    local_24 = (*(pVm->sVmConsumer).xConsumer)
                         (pString->zString,pString->nByte,(pVm->sVmConsumer).pUserData);
    pVm->nOutputLen = pString->nByte + pVm->nOutputLen;
  }
  return local_24;
}

Assistant:

JX9_PRIVATE sxi32 jx9VmOutputConsume(
	jx9_vm *pVm,      /* Target VM */
	SyString *pString /* Message to output */
	)
{
	jx9_output_consumer *pCons = &pVm->sVmConsumer;
	sxi32 rc = SXRET_OK;
	/* Call the output consumer */
	if( pString->nByte > 0 ){
		rc = pCons->xConsumer((const void *)pString->zString, pString->nByte, pCons->pUserData);
		/* Increment output length */
		pVm->nOutputLen += pString->nByte;
	}
	return rc;
}